

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O2

void dfheader(FILE *f)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  Fatal *this;
  time_t tm;
  utsname u;
  char hname [256];
  time_t local_2a8;
  utsname local_29e;
  char local_118 [264];
  
  fputs(start4,(FILE *)f);
  time(&local_2a8);
  __s = ctime(&local_2a8);
  sVar2 = strlen(__s);
  __s[sVar2 - 1] = '\0';
  dfpair(f,"wall start date","%s",__s);
  walltime();
  dfpair(f,"wall start time","%g");
  memset(local_118,0,0x100);
  iVar1 = gethostname(local_118,0x100);
  if (iVar1 == -1) {
    this = (Fatal *)__cxa_allocate_exception(0x80);
    Fatal::Fatal(this,"gethostname failed, unable to print machine id\n");
  }
  else {
    iVar1 = uname(&local_29e);
    if (iVar1 != -1) {
      dfpair(f,"machine id","%s-%s-%s-%s",local_118,&local_29e,local_29e.release,local_29e.machine);
      return;
    }
    this = (Fatal *)__cxa_allocate_exception(0x80);
    Fatal::Fatal(this,"uname failed\n");
  }
  __cxa_throw(this,&Fatal::typeinfo,0);
}

Assistant:

void dfheader(FILE *f) {
	fputs(start4, f);

	time_t tm;
	time(&tm);
	char *tstr = ctime(&tm);
	tstr[strlen(tstr)-1] = '\0';
	dfpair(f, "wall start date", "%s", tstr);

	dfpair(f, "wall start time", "%g", walltime());
	machineid(f);
}